

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O2

void testcursors(wins *wins_ar,int ar_len)

{
  long *plVar1;
  char cVar2;
  char *pcVar3;
  Am_Cursor rom_cursor;
  Am_Image_Array rom_mask;
  Am_Image_Array rom;
  Am_Cursor crosshair_cursor;
  Am_Image_Array crosshair_mask;
  Am_Image_Array crosshair;
  Am_Cursor borg_cursor;
  Am_Image_Array borg_mask;
  Am_Image_Array borg;
  Am_Cursor ds9_cursor;
  Am_Image_Array ds9_mask;
  Am_Image_Array ds9;
  Am_Image_Array happy_mask;
  Am_Image_Array happy;
  Am_Cursor local_138 [8];
  Am_Style local_130 [8];
  Am_Image_Array local_128 [8];
  Am_Image_Array local_120 [8];
  Am_Cursor local_118 [8];
  Am_Style local_110 [8];
  Am_Image_Array local_108 [8];
  Am_Image_Array local_100 [8];
  Am_Cursor local_f8 [8];
  Am_Style local_f0 [8];
  Am_Image_Array local_e8 [8];
  Am_Image_Array local_e0 [8];
  Am_Cursor local_d8 [8];
  Am_Style local_d0 [8];
  Am_Image_Array local_c8 [8];
  Am_Image_Array local_c0 [8];
  Am_Style local_b8 [8];
  Am_Image_Array local_b0 [8];
  Am_Image_Array local_a8 [8];
  wins *local_a0;
  ulong local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  long *local_78;
  ulong local_70;
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Cursor local_48 [8];
  Am_Style local_40 [8];
  Am_Cursor happy_cursor;
  
  local_70 = 0;
  local_98 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    local_98 = local_70;
  }
  local_98 = local_98 << 6;
  local_a0 = wins_ar;
  for (; local_98 != local_70; local_70 = local_70 + 0x40) {
    plVar1 = *(long **)((long)&local_a0->d1 + local_70);
    local_78 = *(long **)((long)&local_a0->d2 + local_70);
    local_80 = *(long **)((long)&local_a0->d3 + local_70);
    local_88 = *(long **)((long)&local_a0->d4 + local_70);
    local_90 = *(long **)((long)&local_a0->d5 + local_70);
    pcVar3 = (char *)Am_Merge_Pathname("images/happy.xbm");
    Am_Image_Array::Am_Image_Array(&happy,pcVar3);
    pcVar3 = (char *)Am_Merge_Pathname("images/happy_mask.xbm");
    Am_Image_Array::Am_Image_Array(&happy_mask,pcVar3);
    Am_Image_Array::Am_Image_Array(local_a8,&happy);
    Am_Image_Array::Am_Image_Array(local_b0,&happy_mask);
    Am_Style::Am_Style(local_b8,(Am_Style *)&Am_Purple);
    Am_Style::Am_Style(local_40,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(&happy_cursor,local_a8,local_b0,local_b8,local_40);
    Am_Style::~Am_Style(local_40);
    Am_Style::~Am_Style(local_b8);
    Am_Image_Array::~Am_Image_Array(local_b0);
    Am_Image_Array::~Am_Image_Array(local_a8);
    cVar2 = Am_Cursor::Valid();
    if (cVar2 == '\0') {
      fwrite("happy_cursor didn\'t work.\n",0x1a,1,_stderr);
    }
    else {
      Am_Cursor::Am_Cursor(local_48,&happy_cursor);
      (**(code **)(*plVar1 + 0x1c0))(plVar1,local_48);
      Am_Cursor::~Am_Cursor(local_48);
    }
    pcVar3 = (char *)Am_Merge_Pathname("images/ds9.xbm");
    Am_Image_Array::Am_Image_Array(&ds9,pcVar3);
    pcVar3 = (char *)Am_Merge_Pathname("images/ds9_mask.xbm");
    Am_Image_Array::Am_Image_Array(&ds9_mask,pcVar3);
    Am_Image_Array::Am_Image_Array(local_c0,&ds9);
    Am_Image_Array::Am_Image_Array(local_c8,&ds9_mask);
    Am_Style::Am_Style(local_d0,(Am_Style *)&Am_Blue);
    Am_Style::Am_Style(local_50,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(&ds9_cursor,local_c0,local_c8,local_d0,local_50);
    Am_Style::~Am_Style(local_50);
    Am_Style::~Am_Style(local_d0);
    Am_Image_Array::~Am_Image_Array(local_c8);
    Am_Image_Array::~Am_Image_Array(local_c0);
    cVar2 = Am_Cursor::Valid();
    if (cVar2 == '\0') {
      fwrite("ds9_cursor didn\'t work.\n",0x18,1,_stderr);
    }
    else {
      Am_Cursor::Am_Cursor(local_d8,&ds9_cursor);
      (**(code **)(*local_78 + 0x1c0))(local_78,local_d8);
      Am_Cursor::~Am_Cursor(local_d8);
    }
    pcVar3 = (char *)Am_Merge_Pathname("images/borg.xbm");
    Am_Image_Array::Am_Image_Array(&borg,pcVar3);
    pcVar3 = (char *)Am_Merge_Pathname("images/borg_mask.xbm");
    Am_Image_Array::Am_Image_Array(&borg_mask,pcVar3);
    Am_Image_Array::Am_Image_Array(local_e0,&borg);
    Am_Image_Array::Am_Image_Array(local_e8,&borg_mask);
    Am_Style::Am_Style(local_f0,(Am_Style *)&Am_Red);
    Am_Style::Am_Style(local_58,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(&borg_cursor,local_e0,local_e8,local_f0,local_58);
    Am_Style::~Am_Style(local_58);
    Am_Style::~Am_Style(local_f0);
    Am_Image_Array::~Am_Image_Array(local_e8);
    Am_Image_Array::~Am_Image_Array(local_e0);
    cVar2 = Am_Cursor::Valid();
    if (cVar2 == '\0') {
      fwrite("borg_cursor didn\'t work.\n",0x19,1,_stderr);
    }
    else {
      Am_Cursor::Am_Cursor(local_f8,&borg_cursor);
      (**(code **)(*local_80 + 0x1c0))(local_80,local_f8);
      Am_Cursor::~Am_Cursor(local_f8);
    }
    pcVar3 = (char *)Am_Merge_Pathname("images/crosshair.xbm");
    Am_Image_Array::Am_Image_Array(&crosshair,pcVar3);
    pcVar3 = (char *)Am_Merge_Pathname("images/crosshair_mask.xbm");
    Am_Image_Array::Am_Image_Array(&crosshair_mask,pcVar3);
    Am_Image_Array::Am_Image_Array(local_100,&crosshair);
    Am_Image_Array::Am_Image_Array(local_108,&crosshair_mask);
    Am_Style::Am_Style(local_110,(Am_Style *)&Am_Black);
    Am_Style::Am_Style(local_60,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(&crosshair_cursor,local_100,local_108,local_110,local_60);
    Am_Style::~Am_Style(local_60);
    Am_Style::~Am_Style(local_110);
    Am_Image_Array::~Am_Image_Array(local_108);
    Am_Image_Array::~Am_Image_Array(local_100);
    cVar2 = Am_Cursor::Valid();
    if (cVar2 == '\0') {
      fwrite("crosshair_cursor didn\'t work.\n",0x1e,1,_stderr);
    }
    else {
      Am_Cursor::Am_Cursor(local_118,&crosshair_cursor);
      (**(code **)(*local_88 + 0x1c0))(local_88,local_118);
      Am_Cursor::~Am_Cursor(local_118);
    }
    pcVar3 = (char *)Am_Merge_Pathname("images/rom.xbm");
    Am_Image_Array::Am_Image_Array(&rom,pcVar3);
    pcVar3 = (char *)Am_Merge_Pathname("images/rom_mask.xbm");
    Am_Image_Array::Am_Image_Array(&rom_mask,pcVar3);
    Am_Image_Array::Am_Image_Array(local_120,&rom);
    Am_Image_Array::Am_Image_Array(local_128,&rom_mask);
    Am_Style::Am_Style(local_130,(Am_Style *)&Am_Green);
    Am_Style::Am_Style(local_68,(Am_Style *)&Am_White);
    Am_Cursor::Am_Cursor(&rom_cursor,local_120,local_128,local_130,local_68);
    Am_Style::~Am_Style(local_68);
    Am_Style::~Am_Style(local_130);
    Am_Image_Array::~Am_Image_Array(local_128);
    Am_Image_Array::~Am_Image_Array(local_120);
    cVar2 = Am_Cursor::Valid();
    if (cVar2 == '\0') {
      fwrite("rom_cursor didn\'t work.\n",0x18,1,_stderr);
    }
    else {
      Am_Cursor::Am_Cursor(local_138,&rom_cursor);
      (**(code **)(*local_90 + 0x1c0))(local_90,local_138);
      Am_Cursor::~Am_Cursor(local_138);
    }
    Am_Cursor::~Am_Cursor(&rom_cursor);
    Am_Image_Array::~Am_Image_Array(&rom_mask);
    Am_Image_Array::~Am_Image_Array(&rom);
    Am_Cursor::~Am_Cursor(&crosshair_cursor);
    Am_Image_Array::~Am_Image_Array(&crosshair_mask);
    Am_Image_Array::~Am_Image_Array(&crosshair);
    Am_Cursor::~Am_Cursor(&borg_cursor);
    Am_Image_Array::~Am_Image_Array(&borg_mask);
    Am_Image_Array::~Am_Image_Array(&borg);
    Am_Cursor::~Am_Cursor(&ds9_cursor);
    Am_Image_Array::~Am_Image_Array(&ds9_mask);
    Am_Image_Array::~Am_Image_Array(&ds9);
    Am_Cursor::~Am_Cursor(&happy_cursor);
    Am_Image_Array::~Am_Image_Array(&happy_mask);
    Am_Image_Array::~Am_Image_Array(&happy);
  }
  return;
}

Assistant:

void
testcursors(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d1 = wins_ar[i].d1;
    Am_Drawonable *d2 = wins_ar[i].d2;
    Am_Drawonable *d3 = wins_ar[i].d3;
    Am_Drawonable *d4 = wins_ar[i].d4;
    Am_Drawonable *d5 = wins_ar[i].d5;

    Am_Image_Array happy(Am_Merge_Pathname(IMFN_HAPPY));
    Am_Image_Array happy_mask(Am_Merge_Pathname(IMFN_HAPPY_M));
    Am_Cursor happy_cursor(happy, happy_mask, Am_Purple, Am_White);
    if (happy_cursor.Valid())
      d1->Set_Cursor(happy_cursor);
    else
      fprintf(stderr, "happy_cursor didn't work.\n");

    Am_Image_Array ds9(Am_Merge_Pathname(IMFN_DS9));
    Am_Image_Array ds9_mask(Am_Merge_Pathname(IMFN_DS9_M));
    Am_Cursor ds9_cursor(ds9, ds9_mask, Am_Blue, Am_White);
    if (ds9_cursor.Valid())
      d2->Set_Cursor(ds9_cursor);
    else
      fprintf(stderr, "ds9_cursor didn't work.\n");

    Am_Image_Array borg(Am_Merge_Pathname(IMFN_BORG));
    Am_Image_Array borg_mask(Am_Merge_Pathname(IMFN_BORG_M));
    Am_Cursor borg_cursor(borg, borg_mask, Am_Red, Am_White);
    if (borg_cursor.Valid())
      d3->Set_Cursor(borg_cursor);
    else
      fprintf(stderr, "borg_cursor didn't work.\n");

    Am_Image_Array crosshair(Am_Merge_Pathname(IMFN_CROSSHR));
    Am_Image_Array crosshair_mask(Am_Merge_Pathname(IMFN_CROSSHR_M));
    Am_Cursor crosshair_cursor(crosshair, crosshair_mask, Am_Black, Am_White);
    if (crosshair_cursor.Valid())
      d4->Set_Cursor(crosshair_cursor);
    else
      fprintf(stderr, "crosshair_cursor didn't work.\n");

    Am_Image_Array rom(Am_Merge_Pathname(IMFN_ROM));
    Am_Image_Array rom_mask(Am_Merge_Pathname(IMFN_ROM_M));
    Am_Cursor rom_cursor(rom, rom_mask, Am_Green, Am_White);
    if (rom_cursor.Valid())
      d5->Set_Cursor(rom_cursor);
    else
      fprintf(stderr, "rom_cursor didn't work.\n");
  }
}